

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operations.cpp
# Opt level: O2

bool duckdb::ValuePositionComparator::Final<duckdb::GreaterThanEquals>(Value *lhs,Value *rhs)

{
  bool bVar1;
  
  bVar1 = ValueOperations::DistinctGreaterThan(rhs,lhs);
  return !bVar1;
}

Assistant:

bool ValuePositionComparator::Final<duckdb::GreaterThanEquals>(const Value &lhs, const Value &rhs) {
	return !ValuePositionComparator::Final<duckdb::GreaterThan>(rhs, lhs);
}